

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

int E_IntLoop(int n1,int n2,int type,int type_2,int si1,int sj1,int sp1,int sq1,vrna_param_t *P)

{
  double dVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  double dVar3;
  int in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000018;
  int energy;
  int u;
  int ns;
  int nl;
  int local_68;
  int local_54;
  int local_50;
  int local_40;
  int local_30;
  int local_2c;
  int local_24;
  int local_20;
  int local_4;
  
  local_24 = in_EDI;
  local_20 = in_ESI;
  if (in_ESI < in_EDI) {
    local_24 = in_ESI;
    local_20 = in_EDI;
  }
  if (local_20 == 0) {
    local_4 = *(int *)(in_stack_00000018 + 4 + (long)in_EDX * 0x20 + (long)in_ECX * 4);
  }
  else if (local_24 == 0) {
    if (local_20 < 0x1f) {
      local_30 = *(int *)(in_stack_00000018 + 0x180 + (long)local_20 * 4);
    }
    else {
      local_30 = *(int *)(in_stack_00000018 + 0x1f8);
      dVar1 = *(double *)(in_stack_00000018 + 0x31d90);
      dVar3 = log((double)local_20 / 30.0);
      local_30 = local_30 + (int)(dVar1 * dVar3);
    }
    local_2c = local_30;
    if (local_20 == 1) {
      local_2c = *(int *)(in_stack_00000018 + 4 + (long)in_EDX * 0x20 + (long)in_ECX * 4) + local_30
      ;
    }
    else {
      if (2 < in_EDX) {
        local_2c = *(int *)(in_stack_00000018 + 0x31e00) + local_30;
      }
      if (2 < in_ECX) {
        local_2c = *(int *)(in_stack_00000018 + 0x31e00) + local_2c;
      }
    }
    local_4 = local_2c;
  }
  else if (local_24 == 1) {
    if (local_20 == 1) {
      local_4 = *(int *)(in_stack_00000018 + 0x1678 + (long)in_EDX * 800 + (long)in_ECX * 100 +
                         (long)in_R8D * 0x14 + (long)in_R9D * 4);
    }
    else if (local_20 == 2) {
      if (in_EDI == 1) {
        local_2c = *(int *)(in_stack_00000018 + 0x2f78 + (long)in_EDX * 4000 + (long)in_ECX * 500 +
                            (long)in_R8D * 100 + (long)in_stack_00000010 * 0x14 + (long)in_R9D * 4);
      }
      else {
        local_2c = *(int *)(in_stack_00000018 + 0x2f78 + (long)in_ECX * 4000 + (long)in_EDX * 500 +
                            (long)in_stack_00000010 * 100 + (long)in_R8D * 0x14 +
                           (long)in_stack_00000008 * 4);
      }
      local_4 = local_2c;
    }
    else {
      if (local_20 + 1 < 0x1f) {
        local_40 = *(int *)(in_stack_00000018 + 0x1fc + (long)(local_20 + 1) * 4);
      }
      else {
        local_40 = *(int *)(in_stack_00000018 + 0x274);
        dVar1 = *(double *)(in_stack_00000018 + 0x31d90);
        dVar3 = log((double)(local_20 + 1) / 30.0);
        local_40 = local_40 + (int)(dVar1 * dVar3);
      }
      if (MAX_NINIO < (local_20 + -1) * *(int *)(in_stack_00000018 + 0x31d80)) {
        local_50 = MAX_NINIO;
      }
      else {
        local_50 = (local_20 + -1) * *(int *)(in_stack_00000018 + 0x31d80);
      }
      local_4 = *(int *)(in_stack_00000018 + 0x8b8 + (long)in_EDX * 100 + (long)in_R8D * 0x14 +
                        (long)in_R9D * 4) +
                *(int *)(in_stack_00000018 + 0x8b8 + (long)in_ECX * 100 +
                         (long)in_stack_00000010 * 0x14 + (long)in_stack_00000008 * 4) +
                local_50 + local_40;
    }
  }
  else {
    if (local_24 == 2) {
      if (local_20 == 2) {
        return *(int *)(in_stack_00000018 + 0xac78 + (long)in_EDX * 20000 + (long)in_ECX * 0x9c4 +
                        (long)in_R8D * 500 + (long)in_stack_00000008 * 100 +
                        (long)in_stack_00000010 * 0x14 + (long)in_R9D * 4);
      }
      if (local_20 == 3) {
        return *(int *)(in_stack_00000018 + 0xbd8 + (long)in_EDX * 100 + (long)in_R8D * 0x14 +
                       (long)in_R9D * 4) +
               *(int *)(in_stack_00000018 + 0xbd8 + (long)in_ECX * 100 +
                        (long)in_stack_00000010 * 0x14 + (long)in_stack_00000008 * 4) +
               *(int *)(in_stack_00000018 + 0x210) + *(int *)(in_stack_00000018 + 0x31d80);
      }
    }
    iVar2 = local_20 + local_24;
    if (iVar2 < 0x1f) {
      local_54 = *(int *)(in_stack_00000018 + 0x1fc + (long)iVar2 * 4);
    }
    else {
      local_54 = *(int *)(in_stack_00000018 + 0x274);
      dVar1 = *(double *)(in_stack_00000018 + 0x31d90);
      dVar3 = log((double)iVar2 / 30.0);
      local_54 = local_54 + (int)(dVar1 * dVar3);
    }
    if (MAX_NINIO < (local_20 - local_24) * *(int *)(in_stack_00000018 + 0x31d80)) {
      local_68 = MAX_NINIO;
    }
    else {
      local_68 = (local_20 - local_24) * *(int *)(in_stack_00000018 + 0x31d80);
    }
    local_4 = *(int *)(in_stack_00000018 + 0x598 + (long)in_EDX * 100 + (long)in_R8D * 0x14 +
                      (long)in_R9D * 4) +
              *(int *)(in_stack_00000018 + 0x598 + (long)in_ECX * 100 +
                       (long)in_stack_00000010 * 0x14 + (long)in_stack_00000008 * 4) +
              local_68 + local_54;
  }
  return local_4;
}

Assistant:

PRIVATE INLINE int
E_IntLoop(int           n1,
          int           n2,
          int           type,
          int           type_2,
          int           si1,
          int           sj1,
          int           sp1,
          int           sq1,
          vrna_param_t  *P)
{
  /* compute energy of degree 2 loop (stack bulge or interior) */
  int nl, ns, u, energy;

  energy = INF;

  if (n1 > n2) {
    nl  = n1;
    ns  = n2;
  } else {
    nl  = n2;
    ns  = n1;
  }

  if (nl == 0)
    return P->stack[type][type_2];  /* stack */

  if (ns == 0) {
    /* bulge */
    energy = (nl <= MAXLOOP) ? P->bulge[nl] :
             (P->bulge[30] + (int)(P->lxc * log(nl / 30.)));
    if (nl == 1) {
      energy += P->stack[type][type_2];
    } else {
      if (type > 2)
        energy += P->TerminalAU;

      if (type_2 > 2)
        energy += P->TerminalAU;
    }

    return energy;
  } else {
    /* interior loop */
    if (ns == 1) {
      if (nl == 1)                    /* 1x1 loop */
        return P->int11[type][type_2][si1][sj1];

      if (nl == 2) {
        /* 2x1 loop */
        if (n1 == 1)
          energy = P->int21[type][type_2][si1][sq1][sj1];
        else
          energy = P->int21[type_2][type][sq1][si1][sp1];

        return energy;
      } else {
        /* 1xn loop */
        energy =
          (nl + 1 <=
           MAXLOOP) ? (P->internal_loop[nl + 1]) : (P->internal_loop[30] +
                                                    (int)(P->lxc * log((nl + 1) / 30.)));
        energy  += MIN2(MAX_NINIO, (nl - ns) * P->ninio[2]);
        energy  += P->mismatch1nI[type][si1][sj1] + P->mismatch1nI[type_2][sq1][sp1];
        return energy;
      }
    } else if (ns == 2) {
      if (nl == 2) {
        /* 2x2 loop */
        return P->int22[type][type_2][si1][sp1][sq1][sj1];
      } else if (nl == 3) {
        /* 2x3 loop */
        energy  = P->internal_loop[5] + P->ninio[2];
        energy  += P->mismatch23I[type][si1][sj1] + P->mismatch23I[type_2][sq1][sp1];
        return energy;
      }
    }

    {
      /* generic interior loop (no else here!)*/
      u       = nl + ns;
      energy  =
        (u <=
         MAXLOOP) ? (P->internal_loop[u]) : (P->internal_loop[30] + (int)(P->lxc * log((u) / 30.)));

      energy += MIN2(MAX_NINIO, (nl - ns) * P->ninio[2]);

      energy += P->mismatchI[type][si1][sj1] + P->mismatchI[type_2][sq1][sp1];
    }
  }

  return energy;
}